

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
calcOrientationHist(vector<double,_std::allocator<double>_> *__return_storage_ptr__,Mat *image,
                   Point2f *tmp,Point2f *center,double *angle)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  reference pvVar4;
  size_type sVar5;
  int *i;
  vector<double,_std::allocator<double>_> *pvVar6;
  double dVar7;
  double dVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double proportion;
  double dStack_1c0;
  int bin;
  int local_1b8;
  int local_1b4;
  double local_1b0;
  double neighborMag;
  double neighborParam;
  double neighborAngle;
  double neighborR;
  double neighborC;
  uint c;
  uint r;
  MatSize local_160;
  _InputArray local_158;
  _OutputArray local_140;
  _InputArray local_128;
  undefined1 local_110 [8];
  Mat tmp_image;
  undefined1 local_a8 [8];
  Mat rot_mat;
  allocator<double> local_32;
  byte local_31;
  double *local_30;
  double *angle_local;
  Point2f *center_local;
  Point2f *tmp_local;
  Mat *image_local;
  vector<double,_std::allocator<double>_> *tmpBin;
  
  local_31 = 0;
  local_30 = angle;
  angle_local = (double *)center;
  center_local = tmp;
  tmp_local = (Point2f *)image;
  image_local = (Mat *)__return_storage_ptr__;
  std::allocator<double>::allocator(&local_32);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,8,&local_32);
  std::allocator<double>::~allocator(&local_32);
  cv::Point_<float>::Point_((Point_<float> *)(tmp_image.step.buf + 1),center_local);
  cv::getRotationMatrix2D((Mat *)local_a8,(Point2f *)(tmp_image.step.buf + 1),*local_30,1.0);
  cv::Mat::Mat((Mat *)local_110);
  cv::_InputArray::_InputArray(&local_128,(Mat *)tmp_local);
  cv::_OutputArray::_OutputArray(&local_140,(Mat *)local_110);
  cv::_InputArray::_InputArray(&local_158,(Mat *)local_a8);
  cv::MatSize::operator()(&local_160);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&c);
  cv::warpAffine(&local_128,&local_140,&local_158,&local_160,1,0,&c);
  cv::_InputArray::~_InputArray(&local_158);
  cv::_OutputArray::~_OutputArray(&local_140);
  cv::_InputArray::~_InputArray(&local_128);
  for (neighborC._4_4_ = (uint)(long)center_local->y; (float)neighborC._4_4_ < center_local->y + 4.0
      ; neighborC._4_4_ = neighborC._4_4_ + 1) {
    for (neighborC._0_4_ = (uint)(long)center_local->x;
        (float)neighborC._0_4_ < center_local->x + 4.0; neighborC._0_4_ = neighborC._0_4_ + 1) {
      pbVar3 = cv::Mat::at<unsigned_char>((Mat *)tmp_local,neighborC._4_4_,neighborC._0_4_ + 1);
      bVar1 = *pbVar3;
      pbVar3 = cv::Mat::at<unsigned_char>((Mat *)tmp_local,neighborC._4_4_,neighborC._0_4_ - 1);
      neighborR = (double)bVar1 - (double)*pbVar3;
      pbVar3 = cv::Mat::at<unsigned_char>((Mat *)tmp_local,neighborC._4_4_ + 1,neighborC._0_4_);
      bVar1 = *pbVar3;
      pbVar3 = cv::Mat::at<unsigned_char>((Mat *)tmp_local,neighborC._4_4_ - 1,neighborC._0_4_);
      neighborAngle = (double)bVar1 - (double)*pbVar3;
      neighborParam = calAngle(neighborR,neighborAngle);
      local_1b0 = pow(neighborR * neighborR + neighborAngle * neighborAngle,0.5);
      local_1b4 = (int)((float)neighborC._0_4_ - *(float *)angle_local);
      local_1b8 = (int)((float)neighborC._4_4_ - *(float *)((long)angle_local + 4));
      dStack_1c0 = 2.0;
      i = &local_1b4;
      dVar7 = weight(i,&local_1b8,&stack0xfffffffffffffe40);
      dVar7 = dVar7 * local_1b0;
      local_1b0 = dVar7;
      if ((-1 < (int)(neighborParam / 45.0)) && ((int)(neighborParam / 45.0) < 10)) {
        iVar2 = (int)(neighborParam / 45.0);
        dVar8 = (neighborParam - (double)(iVar2 * 0x2d)) / 45.0 - 0.5;
        if (dVar8 <= 0.0) {
          std::abs((int)i);
          dVar7 = -extraout_XMM0_Qa * local_1b0;
          pvVar6 = __return_storage_ptr__;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (__return_storage_ptr__,(long)iVar2);
          *pvVar4 = dVar7 + 1.0 + *pvVar4;
          if (iVar2 < 1) {
            std::abs((int)pvVar6);
            dVar7 = local_1b0;
            sVar5 = std::vector<double,_std::allocator<double>_>::size(__return_storage_ptr__);
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               (__return_storage_ptr__,sVar5 - 1);
            *pvVar4 = extraout_XMM0_Qa_01 * dVar7 + *pvVar4;
          }
          else {
            std::abs((int)pvVar6);
            dVar7 = local_1b0;
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               (__return_storage_ptr__,(long)(iVar2 + -1));
            *pvVar4 = extraout_XMM0_Qa_00 * dVar7 + *pvVar4;
          }
        }
        else {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (__return_storage_ptr__,(long)iVar2);
          *pvVar4 = (1.0 - dVar8) * dVar7 + *pvVar4;
          sVar5 = std::vector<double,_std::allocator<double>_>::size(__return_storage_ptr__);
          dVar7 = local_1b0;
          if ((ulong)(long)iVar2 < sVar5 - 1) {
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               (__return_storage_ptr__,(long)(iVar2 + 1));
            *pvVar4 = dVar8 * dVar7 + *pvVar4;
          }
          else {
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               (__return_storage_ptr__,0);
            *pvVar4 = dVar8 * dVar7 + *pvVar4;
          }
        }
      }
    }
  }
  Normalize(__return_storage_ptr__);
  local_31 = 1;
  cv::Mat::~Mat((Mat *)local_110);
  cv::Mat::~Mat((Mat *)local_a8);
  if ((local_31 & 1) == 0) {
    std::vector<double,_std::allocator<double>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> calcOrientationHist(const Mat& image, const Point2f& tmp, const Point2f& center, const double& angle){
    vector<double> tmpBin(n_cell_bin);
    Mat rot_mat = getRotationMatrix2D(tmp, angle, 1.0);
    Mat tmp_image;
    warpAffine(image, tmp_image, rot_mat, image.size());
    // imshow("test", tmp_image);
    // waitKey(0);

    for(unsigned r = tmp.y; r < tmp.y+cell_width; r++){
        for(unsigned c = tmp.x; c < tmp.x+cell_width; c++){
            double neighborC, neighborR, neighborAngle, neighborParam, neighborMag;
            neighborC = (double)image.at<uchar>(r, c+1) - (double)image.at<uchar>(r, c-1);
            neighborR = (double)image.at<uchar>(r+1, c) - (double)image.at<uchar>(r-1, c);
            neighborAngle = calAngle(neighborC, neighborR);
            neighborMag = pow(neighborC * neighborC + neighborR * neighborR, 0.5);
            neighborMag *= weight(c-center.x, r-center.y, 0.5 * block_width);

            if( 0 <= int(neighborAngle/45) && int(neighborAngle/45) <= 9){
                int bin = neighborAngle/45;
                double proportion = (neighborAngle-bin*45)/45.0 - 0.5;
                // cout << bin << "    " << proportion << "    " << 1-proportion << endl;
                
                if(proportion > 0){
                    tmpBin[bin] += (1-proportion) * neighborMag;
                    if(bin < tmpBin.size()-1){
                        tmpBin[bin+1] += proportion * neighborMag;
                    }
                    else
                        tmpBin[0] += proportion * neighborMag;
                }
                else{
                    tmpBin[bin] += 1-abs(proportion) * neighborMag;
                    if(bin > 0)
                        tmpBin[bin-1] += abs(proportion) * neighborMag;
                    else
                        tmpBin[tmpBin.size()-1] += abs(proportion) * neighborMag;
                }
            }
        }
    }
    Normalize(tmpBin);
    // ReNormalize(tmpBin);
    return tmpBin;
}